

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

void __thiscall
amrex::MLMG::getFluxes
          (MLMG *this,
          Vector<std::array<amrex::MultiFab_*,_3UL>,_std::allocator<std::array<amrex::MultiFab_*,_3UL>_>_>
          *a_flux,Location a_loc)

{
  pointer pAVar1;
  bool bVar2;
  Any *s;
  pointer this_00;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> solmf;
  MultiFab *local_50;
  _Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_48;
  
  bVar2 = MLLinOp::isCellCentered(this->linop);
  if (!bVar2) {
    Abort_host("Calling wrong getFluxes for nodal solver");
  }
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pAVar1 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
           super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->sol).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                 super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pAVar1; this_00 = this_00 + 1) {
    local_50 = Any::get<amrex::MultiFab>(this_00);
    std::vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>>::emplace_back<amrex::MultiFab*>
              ((vector<amrex::MultiFab*,std::allocator<amrex::MultiFab*>> *)&local_48,&local_50);
  }
  getFluxes(this,a_flux,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_48,
            a_loc);
  std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base(&local_48)
  ;
  return;
}

Assistant:

void
MLMG::getFluxes (const Vector<Array<MultiFab*,AMREX_SPACEDIM> >& a_flux,
                 Location a_loc)
{
    if (!linop.isCellCentered()) {
       amrex::Abort("Calling wrong getFluxes for nodal solver");
    }

    AMREX_ASSERT(sol.size() == a_flux.size());
    Vector<MultiFab*> solmf;
    for (auto & s : sol) {
        solmf.push_back(&(s.get<MultiFab>()));
    }
    getFluxes(a_flux, solmf, a_loc);
}